

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O1

unique_ptr<spvtools::opt::analysis::IntConstant,_std::default_delete<spvtools::opt::analysis::IntConstant>_>
 __thiscall spvtools::opt::analysis::IntConstant::CopyIntConstant(IntConstant *this)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  long in_RSI;
  
  p_Var1 = (_func_int *)(**(code **)(**(long **)(in_RSI + 8) + 0x50))();
  pp_Var2 = (_func_int **)operator_new(0x28);
  pp_Var2[1] = p_Var1;
  *pp_Var2 = (_func_int *)&PTR__ScalarConstant_003ef598;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(pp_Var2 + 2),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RSI + 0x10));
  *pp_Var2 = (_func_int *)&PTR__ScalarConstant_003ef670;
  (this->super_ScalarConstant).super_Constant._vptr_Constant = pp_Var2;
  return (__uniq_ptr_data<spvtools::opt::analysis::IntConstant,_std::default_delete<spvtools::opt::analysis::IntConstant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::IntConstant,_std::default_delete<spvtools::opt::analysis::IntConstant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<IntConstant> CopyIntConstant() const {
    return MakeUnique<IntConstant>(type_->AsInteger(), words_);
  }